

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O3

bool __thiscall DIS::SystemIdentifier::operator==(SystemIdentifier *this,SystemIdentifier *rhs)

{
  return (this->_systemName == rhs->_systemName && this->_systemType == rhs->_systemType) &&
         (this->_changeOptions == rhs->_changeOptions && rhs->_systemMode == this->_systemMode);
}

Assistant:

bool SystemIdentifier::operator ==(const SystemIdentifier& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_systemType == rhs._systemType) ) ivarsEqual = false;
     if( ! (_systemName == rhs._systemName) ) ivarsEqual = false;
     if( ! (_systemMode == rhs._systemMode) ) ivarsEqual = false;
     if( ! (_changeOptions == rhs._changeOptions) ) ivarsEqual = false;

    return ivarsEqual;
 }